

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-birth.c
# Opt level: O0

void get_bonuses(void)

{
  player->upkeep->update = player->upkeep->update | 5;
  update_stuff(player);
  player->chp = player->mhp;
  player->csp = player->msp;
  return;
}

Assistant:

static void get_bonuses(void)
{
	/* Calculate the bonuses and hitpoints */
	player->upkeep->update |= (PU_BONUS | PU_HP);

	/* Update stuff */
	update_stuff(player);

	/* Fully healed */
	player->chp = player->mhp;

	/* Fully rested */
	player->csp = player->msp;
}